

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O0

void tif_3uto32s(OPJ_BYTE *pSrc,OPJ_INT32 *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  byte bVar2;
  OPJ_INT32 *pOVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  byte *pbVar7;
  uint local_74;
  int local_70;
  uint dst_6;
  int needed_6;
  uint dst_5;
  int needed_5;
  uint dst_4;
  int needed_4;
  uint dst_3;
  int needed_3;
  uint dst_2;
  int needed_2;
  uint dst_1;
  int needed_1;
  uint dst;
  int needed;
  int available;
  uint val;
  OPJ_UINT32 val2;
  OPJ_UINT32 val1;
  OPJ_UINT32 val0;
  OPJ_SIZE_T i;
  OPJ_SIZE_T length_local;
  OPJ_INT32 *pDst_local;
  OPJ_BYTE *pSrc_local;
  
  pDst_local = (OPJ_INT32 *)pSrc;
  for (_val1 = 0; _val1 < (length & 0xfffffffffffffff8); _val1 = _val1 + 8) {
    bVar6 = (byte)*pDst_local;
    pbVar7 = (byte *)((long)pDst_local + 2);
    bVar1 = *(byte *)((long)pDst_local + 1);
    uVar4 = (uint)bVar1;
    pDst_local = (OPJ_INT32 *)((long)pDst_local + 3);
    bVar2 = *pbVar7;
    pDst[_val1] = (uint)(bVar6 >> 5);
    pDst[_val1 + 1] = (bVar6 & 0x1f) >> 2;
    pDst[_val1 + 2] = (bVar6 & 3) << 1 | (uint)(bVar1 >> 7);
    pDst[_val1 + 3] = (uVar4 & 0x7f) >> 4;
    pDst[_val1 + 4] = (uVar4 & 0xf) >> 1;
    pDst[_val1 + 5] = (uVar4 & 1) << 2 | (uint)(bVar2 >> 6);
    pDst[_val1 + 6] = (bVar2 & 0x3f) >> 3;
    pDst[_val1 + 7] = bVar2 & 7;
  }
  if ((length & 7) != 0) {
    uVar5 = length & 7;
    needed_1 = 3;
    dst_1 = 0;
    bVar6 = (byte)*pDst_local;
    pOVar3 = pDst_local;
    while( true ) {
      pDst_local = (OPJ_INT32 *)((long)pOVar3 + 1);
      needed = (int)bVar6;
      if (needed_1 < 9) break;
      needed_1 = needed_1 + -8;
      dst_1 = (needed | dst_1) << ((byte)needed_1 & 0x1f);
      bVar6 = *(byte *)pDst_local;
      pOVar3 = pDst_local;
    }
    dst = 8 - needed_1;
    pDst[_val1] = (uint)(bVar6 >> (8 - (byte)needed_1 & 0x1f)) & (1 << ((byte)needed_1 & 0x1f)) - 1U
                  | dst_1;
    if (1 < uVar5) {
      needed_2 = 3;
      dst_2 = 0;
      if (dst == 0) {
        needed = (int)*(byte *)pDst_local;
        dst = 8;
        pDst_local = (OPJ_INT32 *)((long)pOVar3 + 2);
      }
      while (bVar6 = (byte)dst, (int)dst < needed_2) {
        needed_2 = needed_2 - dst;
        dst_2 = (needed & (1 << (bVar6 & 0x1f)) - 1U | dst_2) << ((byte)needed_2 & 0x1f);
        needed = (int)(byte)*pDst_local;
        pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        dst = 8;
      }
      dst = dst - needed_2;
      pDst[_val1 + 1] =
           (uint)needed >> (bVar6 - (byte)needed_2 & 0x1f) & (1 << ((byte)needed_2 & 0x1f)) - 1U |
           dst_2;
      if (2 < uVar5) {
        needed_3 = 3;
        dst_3 = 0;
        if (dst == 0) {
          needed = (int)(byte)*pDst_local;
          dst = 8;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
        }
        while (bVar6 = (byte)dst, (int)dst < needed_3) {
          needed_3 = needed_3 - dst;
          dst_3 = (needed & (1 << (bVar6 & 0x1f)) - 1U | dst_3) << ((byte)needed_3 & 0x1f);
          needed = (int)(byte)*pDst_local;
          pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          dst = 8;
        }
        dst = dst - needed_3;
        pDst[_val1 + 2] =
             (uint)needed >> (bVar6 - (byte)needed_3 & 0x1f) & (1 << ((byte)needed_3 & 0x1f)) - 1U |
             dst_3;
        if (3 < uVar5) {
          needed_4 = 3;
          dst_4 = 0;
          if (dst == 0) {
            needed = (int)(byte)*pDst_local;
            dst = 8;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
          }
          while (bVar6 = (byte)dst, (int)dst < needed_4) {
            needed_4 = needed_4 - dst;
            dst_4 = (needed & (1 << (bVar6 & 0x1f)) - 1U | dst_4) << ((byte)needed_4 & 0x1f);
            needed = (int)(byte)*pDst_local;
            pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            dst = 8;
          }
          dst = dst - needed_4;
          pDst[_val1 + 3] =
               (uint)needed >> (bVar6 - (byte)needed_4 & 0x1f) & (1 << ((byte)needed_4 & 0x1f)) - 1U
               | dst_4;
          if (4 < uVar5) {
            needed_5 = 3;
            dst_5 = 0;
            if (dst == 0) {
              needed = (int)(byte)*pDst_local;
              dst = 8;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
            }
            while (bVar6 = (byte)dst, (int)dst < needed_5) {
              needed_5 = needed_5 - dst;
              dst_5 = (needed & (1 << (bVar6 & 0x1f)) - 1U | dst_5) << ((byte)needed_5 & 0x1f);
              needed = (int)(byte)*pDst_local;
              pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              dst = 8;
            }
            dst = dst - needed_5;
            pDst[_val1 + 4] =
                 (uint)needed >> (bVar6 - (byte)needed_5 & 0x1f) &
                 (1 << ((byte)needed_5 & 0x1f)) - 1U | dst_5;
            if (5 < uVar5) {
              needed_6 = 3;
              dst_6 = 0;
              if (dst == 0) {
                needed = (int)(byte)*pDst_local;
                dst = 8;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
              }
              while (bVar6 = (byte)dst, (int)dst < needed_6) {
                needed_6 = needed_6 - dst;
                dst_6 = (needed & (1 << (bVar6 & 0x1f)) - 1U | dst_6) << ((byte)needed_6 & 0x1f);
                needed = (int)(byte)*pDst_local;
                pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                dst = 8;
              }
              dst = dst - needed_6;
              pDst[_val1 + 5] =
                   (uint)needed >> (bVar6 - (byte)needed_6 & 0x1f) &
                   (1 << ((byte)needed_6 & 0x1f)) - 1U | dst_6;
              if (6 < uVar5) {
                local_70 = 3;
                local_74 = 0;
                if (dst == 0) {
                  needed = (int)(byte)*pDst_local;
                  dst = 8;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                }
                while ((int)dst < local_70) {
                  local_70 = local_70 - dst;
                  local_74 = (needed & (1 << ((byte)dst & 0x1f)) - 1U | local_74) <<
                             ((byte)local_70 & 0x1f);
                  needed = (int)(byte)*pDst_local;
                  pDst_local = (OPJ_INT32 *)((long)pDst_local + 1);
                  dst = 8;
                }
                pDst[_val1 + 6] =
                     (uint)needed >> ((byte)dst - (byte)local_70 & 0x1f) &
                     (1 << ((byte)local_70 & 0x1f)) - 1U | local_74;
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void tif_3uto32s(const OPJ_BYTE* pSrc, OPJ_INT32* pDst, OPJ_SIZE_T length)
{
	OPJ_SIZE_T i;
	for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i+=8U) {
		OPJ_UINT32 val0 = *pSrc++;
		OPJ_UINT32 val1 = *pSrc++;
		OPJ_UINT32 val2 = *pSrc++;
		
		pDst[i+0] = (OPJ_INT32)((val0 >> 5));
		pDst[i+1] = (OPJ_INT32)(((val0 & 0x1FU) >> 2));
		pDst[i+2] = (OPJ_INT32)(((val0 & 0x3U) << 1) | (val1 >> 7));
		pDst[i+3] = (OPJ_INT32)(((val1 & 0x7FU) >> 4));
		pDst[i+4] = (OPJ_INT32)(((val1 & 0xFU) >> 1));
		pDst[i+5] = (OPJ_INT32)(((val1 & 0x1U) << 2) | (val2 >> 6));
		pDst[i+6] = (OPJ_INT32)(((val2 & 0x3FU) >> 3));
		pDst[i+7] = (OPJ_INT32)(((val2 & 0x7U)));
		
	}
	if (length & 7U) {
		unsigned int val;
		int available = 0;
		
		length = length & 7U;
		
		GETBITS(pDst[i+0], 3)
		
		if (length > 1U) {
			GETBITS(pDst[i+1], 3)
			if (length > 2U) {
				GETBITS(pDst[i+2], 3)
				if (length > 3U) {
					GETBITS(pDst[i+3], 3)
					if (length > 4U) {
						GETBITS(pDst[i+4], 3)
						if (length > 5U) {
							GETBITS(pDst[i+5], 3)
							if (length > 6U) {
								GETBITS(pDst[i+6], 3)
							}
						}
					}
				}
			}
		}
	}
}